

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O1

int genaNotifyAllExt(UpnpDevice_Handle device_handle,char *UDN,char *servId,IXML_Document *PropSet)

{
  uint uVar1;
  char *propertySet;
  int DbgLineNo;
  
  DbgLineNo = 0;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x3ce,"GENA BEGIN NOTIFY ALL EXT\n");
  propertySet = ixmlPrintNode(&PropSet->n);
  if (propertySet == (char *)0x0) {
    DbgLineNo = 0x3d3;
    uVar1 = 0xffffff9b;
  }
  else {
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x3da,
               "GENERATED PROPERTY SET IN EXT NOTIFY: %s\n",propertySet);
    uVar1 = genaNotifyAllCommon(device_handle,UDN,servId,propertySet);
  }
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",DbgLineNo,
             "GENA END NOTIFY ALL EXT, ret = %d\n",(ulong)uVar1);
  return uVar1;
}

Assistant:

int genaNotifyAllExt(UpnpDevice_Handle device_handle,
	char *UDN,
	char *servId,
	IXML_Document *PropSet)
{
	int ret = GENA_SUCCESS;
	int line = 0;

	DOMString propertySet = NULL;

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENA BEGIN NOTIFY ALL EXT\n");

	propertySet = ixmlPrintNode((IXML_Node *)PropSet);
	if (propertySet == NULL) {
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto ExitFunction;
	}
	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENERATED PROPERTY SET IN EXT NOTIFY: %s\n",
		propertySet);

	ret = genaNotifyAllCommon(device_handle, UDN, servId, propertySet);

ExitFunction:

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		line,
		"GENA END NOTIFY ALL EXT, ret = %d\n",
		ret);

	return ret;
}